

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

bool FastPForLib::Simple16<false>::tryme<7u,1u,7u,2u,7u,1u>(uint32_t *n,size_t len)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  sVar5 = 7;
  if (len < 7) {
    sVar5 = len;
  }
  if (len != 0) {
    lVar1 = 0;
    do {
      if (1 < n[lVar1]) {
        return false;
      }
      lVar1 = lVar1 + 1;
    } while ((int)sVar5 != (int)lVar1);
  }
  uVar2 = len - sVar5;
  uVar4 = 7;
  if (uVar2 < 7) {
    uVar4 = uVar2;
  }
  if (7 < len) {
    lVar1 = 0;
    do {
      if (3 < n[sVar5 + lVar1]) {
        return false;
      }
      lVar1 = lVar1 + 1;
    } while ((int)uVar4 != (int)lVar1);
  }
  uVar6 = 7;
  if (uVar2 - uVar4 < 7) {
    uVar6 = uVar2 - uVar4;
  }
  bVar7 = uVar2 < 8;
  if (!bVar7) {
    uVar3 = (int)uVar4 + (int)sVar5;
    uVar4 = (ulong)uVar3;
    do {
      if (1 < n[uVar4]) {
        return false;
      }
      uVar4 = uVar4 + 1;
      bVar8 = (uint)uVar4 < (int)uVar6 + uVar3;
      bVar7 = !bVar8;
    } while (bVar8);
  }
  return bVar7;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    len -= min1;
    const uint32_t min2 = (len < num2) ? static_cast<uint32_t>(len) : num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    len -= min2;
    const uint32_t min3 = static_cast<uint32_t>((len < num3) ? len : num3);
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if ((n[i]) >= (1U << log3))
        return false;
    }
    return true;
  }